

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

char * sha1_End(SHA1_CTX *context,char *buffer)

{
  byte bVar1;
  long lVar2;
  sha2_byte digest [20];
  
  if (buffer == (char *)0x0) {
    memzero(context,0x60);
    buffer = (char *)0x0;
  }
  else {
    sha1_Final(context,digest);
    for (lVar2 = 0; (int)lVar2 != 0x14; lVar2 = lVar2 + 1) {
      bVar1 = digest[lVar2];
      *buffer = "0123456789abcdef"[bVar1 >> 4];
      buffer[1] = "0123456789abcdef"[bVar1 & 0xf];
      buffer = buffer + 2;
    }
    *buffer = '\0';
  }
  memzero(digest,0x14);
  return buffer;
}

Assistant:

char *sha1_End(trezor::SHA1_CTX* context, char buffer[]) {
	sha2_byte	digest[SHA1_DIGEST_LENGTH], *d = digest;
	int		i;

	if (buffer != (char*)0) {
		sha1_Final(context, digest);

		for (i = 0; i < SHA1_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		memzero(context, sizeof(trezor::SHA1_CTX));
	}
	memzero(digest, SHA1_DIGEST_LENGTH);
	return buffer;
}